

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::GroupSegPlanes(FNodeBuilder *this)

{
  int iVar1;
  int y;
  int x;
  int y_00;
  int y1_00;
  uint uVar2;
  int dx;
  int dy;
  int iVar3;
  int iVar4;
  FPrivSeg *pFVar5;
  FPrivVert *pFVar6;
  undefined1 local_8078 [8];
  FSimpleLine pline;
  FSimpleLine *line;
  fixed_t cdy;
  fixed_t cdx;
  fixed_t cy1;
  fixed_t cx1;
  FPrivSeg *check;
  angle_t ang;
  fixed_t y2;
  fixed_t x2;
  fixed_t y1;
  fixed_t x1;
  FPrivSeg *seg_1;
  FPrivSeg *seg;
  int planenum;
  int i;
  FPrivSeg *buckets [4096];
  int bucketbits;
  FNodeBuilder *this_local;
  
  buckets[0xfff]._4_4_ = 0xc;
  memset(&planenum,0,0x8000);
  for (seg._4_4_ = 0;
      uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs),
      seg._4_4_ < (int)uVar2; seg._4_4_ = seg._4_4_ + 1) {
    pFVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(long)seg._4_4_);
    pFVar5->next = seg._4_4_ + 1;
    pFVar5->hashnext = (FPrivSeg *)0x0;
  }
  uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
  pFVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                     (&this->Segs,(ulong)(uVar2 - 1));
  pFVar5->next = 0xffffffff;
  seg._0_4_ = 0;
  seg._4_4_ = 0;
  do {
    uVar2 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Size(&this->Segs);
    if ((int)uVar2 <= seg._4_4_) {
      TArray<unsigned_char,_unsigned_char>::Reserve(&this->PlaneChecked,((int)seg + 7) / 8);
      return;
    }
    pFVar5 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::operator[]
                       (&this->Segs,(long)seg._4_4_);
    pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar5->v1);
    iVar1 = (pFVar6->super_FSimpleVert).x;
    pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar5->v1);
    y = (pFVar6->super_FSimpleVert).y;
    pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar5->v2);
    x = (pFVar6->super_FSimpleVert).x;
    pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                       (&this->Vertices,(long)pFVar5->v2);
    y_00 = (pFVar6->super_FSimpleVert).y;
    check._4_4_ = PointToAngle(x - iVar1,y_00 - y);
    if (0x7fffffff < check._4_4_) {
      check._4_4_ = check._4_4_ + 0x80000000;
    }
    uVar2 = check._4_4_ >> 0x13;
    for (_cy1 = *(int **)(&planenum + (ulong)uVar2 * 2); _cy1 != (int *)0x0;
        _cy1 = *(int **)(_cy1 + 0x10)) {
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)*_cy1);
      iVar4 = (pFVar6->super_FSimpleVert).x;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)*_cy1);
      y1_00 = (pFVar6->super_FSimpleVert).y;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)_cy1[1]);
      dx = (pFVar6->super_FSimpleVert).x - iVar4;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)_cy1[1]);
      dy = (pFVar6->super_FSimpleVert).y - y1_00;
      iVar3 = PointOnSide(iVar1,y,iVar4,y1_00,dx,dy);
      if ((iVar3 == 0) && (iVar4 = PointOnSide(x,y_00,iVar4,y1_00,dx,dy), iVar4 == 0)) break;
    }
    if (_cy1 == (int *)0x0) {
      pFVar5->hashnext = *(FPrivSeg **)(&planenum + (ulong)uVar2 * 2);
      *(FPrivSeg **)(&planenum + (ulong)uVar2 * 2) = pFVar5;
      pFVar5->planenum = (int)seg;
      pFVar5->planefront = true;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v1);
      local_8078._0_4_ = (pFVar6->super_FSimpleVert).x;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v1);
      local_8078._4_4_ = (pFVar6->super_FSimpleVert).y;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v2);
      iVar1 = (pFVar6->super_FSimpleVert).x;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v1);
      pline.x = iVar1 - (pFVar6->super_FSimpleVert).x;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v2);
      iVar1 = (pFVar6->super_FSimpleVert).y;
      pFVar6 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)pFVar5->v1);
      pline.y = iVar1 - (pFVar6->super_FSimpleVert).y;
      TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Push
                (&this->Planes,(FSimpleLine *)local_8078);
      seg._0_4_ = (int)seg + 1;
    }
    else {
      pFVar5->planenum = _cy1[0xe];
      pline._8_8_ = TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::operator[]
                              (&this->Planes,(long)pFVar5->planenum);
      if (((FSimpleLine *)pline._8_8_)->dx == 0) {
        if (((((FSimpleLine *)pline._8_8_)->dy < 1) || (y_00 <= y)) &&
           ((-1 < ((FSimpleLine *)pline._8_8_)->dy || (y <= y_00)))) {
          pFVar5->planefront = false;
        }
        else {
          pFVar5->planefront = true;
        }
      }
      else if (((((FSimpleLine *)pline._8_8_)->dx < 1) || (x <= iVar1)) &&
              ((-1 < ((FSimpleLine *)pline._8_8_)->dx || (iVar1 <= x)))) {
        pFVar5->planefront = false;
      }
      else {
        pFVar5->planefront = true;
      }
    }
    seg._4_4_ = seg._4_4_ + 1;
  } while( true );
}

Assistant:

void FNodeBuilder::GroupSegPlanes ()
{
	const int bucketbits = 12;
	FPrivSeg *buckets[1<<bucketbits] = { 0 };
	int i, planenum;

	for (i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		seg->next = i+1;
		seg->hashnext = NULL;
	}

	Segs[Segs.Size()-1].next = DWORD_MAX;

	for (i = planenum = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		fixed_t x1 = Vertices[seg->v1].x;
		fixed_t y1 = Vertices[seg->v1].y;
		fixed_t x2 = Vertices[seg->v2].x;
		fixed_t y2 = Vertices[seg->v2].y;
		angle_t ang = PointToAngle (x2 - x1, y2 - y1);

		if (ang >= 1u<<31)
			ang += 1u<<31;

		FPrivSeg *check = buckets[ang >>= 31-bucketbits];

		while (check != NULL)
		{
			fixed_t cx1 = Vertices[check->v1].x;
			fixed_t cy1 = Vertices[check->v1].y;
			fixed_t cdx = Vertices[check->v2].x - cx1;
			fixed_t cdy = Vertices[check->v2].y - cy1;
			if (PointOnSide (x1, y1, cx1, cy1, cdx, cdy) == 0 &&
				PointOnSide (x2, y2, cx1, cy1, cdx, cdy) == 0)
			{
				break;
			}
			check = check->hashnext;
		}
		if (check != NULL)
		{
			seg->planenum = check->planenum;
			const FSimpleLine *line = &Planes[seg->planenum];
			if (line->dx != 0)
			{
				if ((line->dx > 0 && x2 > x1) || (line->dx < 0 && x2 < x1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
			else
			{
				if ((line->dy > 0 && y2 > y1) || (line->dy < 0 && y2 < y1))
				{
					seg->planefront = true;
				}
				else
				{
					seg->planefront = false;
				}
			}
		}
		else
		{
			seg->hashnext = buckets[ang];
			buckets[ang] = seg;
			seg->planenum = planenum++;
			seg->planefront = true;

			FSimpleLine pline = { Vertices[seg->v1].x,
								  Vertices[seg->v1].y,
								  Vertices[seg->v2].x - Vertices[seg->v1].x,
								  Vertices[seg->v2].y - Vertices[seg->v1].y };
			Planes.Push (pline);
		}
	}

	D(Printf ("%d planes from %d segs\n", planenum, Segs.Size()));

	PlaneChecked.Reserve ((planenum + 7) / 8);
}